

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

void __thiscall xLearn::InmemReader::init_from_binary(InmemReader *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  int i;
  ulong uVar4;
  
  DMatrix::Deserialize(&this->data_buf_,&(this->super_Reader).filename_);
  (this->super_Reader).has_label_ = (this->data_buf_).has_label;
  uVar1 = (this->data_buf_).row_length;
  this->num_samples_ = uVar1;
  DMatrix::ReAlloc(&(this->super_Reader).data_samples_,(ulong)uVar1,true);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->order_,(ulong)this->num_samples_);
  puVar2 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar4 = 0; uVar4 < (ulong)((long)puVar3 - (long)puVar2 >> 2); uVar4 = uVar4 + 1) {
    puVar2[uVar4] = (uint)uVar4;
  }
  return;
}

Assistant:

void InmemReader::init_from_binary() {
  // Init data_buf_                               
  data_buf_.Deserialize(filename_);
  has_label_ = data_buf_.has_label;
  // Init data_samples_
  num_samples_ = data_buf_.row_length;
  data_samples_.ReAlloc(num_samples_);
  // for shuffle
  order_.resize(num_samples_);
  for (int i = 0; i < order_.size(); ++i) {
    order_[i] = i;
  }
}